

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,TagSymbol *name)

{
  bool bVar1;
  GlobalName local_38;
  string_view local_28;
  TagSymbol *local_18;
  TagSymbol *name_local;
  CWriter *this_local;
  
  local_18 = name;
  name_local = (TagSymbol *)this;
  bVar1 = IsImport(this,(name->super_GlobalName).name);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"&");
    Write(this,local_28);
  }
  local_38.type = (local_18->super_GlobalName).type;
  local_38._4_4_ = *(undefined4 *)&(local_18->super_GlobalName).field_0x4;
  local_38.name = (local_18->super_GlobalName).name;
  Write(this,&local_38);
  return;
}

Assistant:

void CWriter::Write(const TagSymbol& name) {
  if (!IsImport(name.name)) {
    Write("&");
  }
  Write(GlobalName(name));
}